

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

uint pugi::impl::anon_unknown_0::string_to_integer<unsigned_int>(char_t *value,uint minv,uint maxv)

{
  char cVar1;
  char_t *pcVar2;
  uint local_78;
  uint local_74;
  bool local_6d;
  bool local_69;
  size_t high_bit;
  char_t max_lead;
  size_t max_digits10;
  size_t digits_1;
  char_t *start_1;
  size_t digits;
  char_t *start;
  bool overflow;
  bool negative;
  char_t *s;
  uint result;
  uint maxv_local;
  uint minv_local;
  char_t *value_local;
  uint local_4;
  
  result = 0;
  s = value;
  while (((anonymous_namespace)::chartype_table[(byte)*s] & 8) != 0) {
    s = s + 1;
  }
  cVar1 = *s;
  local_69 = true;
  if (*s != '+') {
    local_69 = *s == '-';
  }
  s = s + (int)(uint)local_69;
  if ((*s == '0') && ((byte)(s[1] | 0x20U) == 0x78)) {
    for (s = s + 2; pcVar2 = s, *s == '0'; s = s + 1) {
    }
    do {
      if ((int)*s - 0x30U < 10) {
        result = result * 0x10 + *s + -0x30;
      }
      else {
        if (5 < ((int)*s | 0x20U) - 0x61) goto LAB_0012e33f;
        result = result * 0x10 + (((int)*s | 0x20U) - 0x57);
      }
      s = s + 1;
    } while( true );
  }
  for (; pcVar2 = s, *s == '0'; s = s + 1) {
  }
  for (; (int)*s - 0x30U < 10; s = s + 1) {
    result = result * 10 + *s + -0x30;
  }
  local_6d = false;
  if (9 < (ulong)((long)s - (long)pcVar2)) {
    local_6d = false;
    if (((long)s - (long)pcVar2 == 10) && (local_6d = true, '3' < *pcVar2)) {
      local_6d = *pcVar2 == '4' && (int)result < 0;
    }
    local_6d = (bool)(local_6d ^ 1);
  }
LAB_0012e468:
  if (cVar1 == '-') {
    local_74 = minv;
    if ((!local_6d) && (result <= -minv)) {
      local_74 = -result;
    }
    local_4 = local_74;
  }
  else {
    local_78 = maxv;
    if ((!local_6d) && (result <= maxv)) {
      local_78 = result;
    }
    local_4 = local_78;
  }
  return local_4;
LAB_0012e33f:
  local_6d = 8 < (ulong)((long)s - (long)pcVar2);
  goto LAB_0012e468;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}